

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

match_t * clipp::detail::prefix_match<clipp::detail::select_flags>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_flags *select)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *this;
  arg_string *this_00;
  subrange sVar2;
  arg_string local_1a0;
  arg_string local_180;
  scoped_dfs_traverser local_160;
  scoped_dfs_traverser local_c0;
  
  do {
    pcVar1 = (pos->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pos->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start == pcVar1) {
      *(_Elt_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
      *(_Map_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
      (__return_storage_ptr__->pos_).scopes_.c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
      *(_Map_pointer *)
       ((long)&(__return_storage_ptr__->pos_).scopes_.c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
      (__return_storage_ptr__->pos_).curMatched_ = false;
      (__return_storage_ptr__->pos_).ignoreBlocks_ = false;
      (__return_storage_ptr__->pos_).repeatGroupStarted_ = false;
      (__return_storage_ptr__->pos_).repeatGroupContinues_ = false;
      *(undefined4 *)&(__return_storage_ptr__->pos_).field_0x9c = 0;
      (__return_storage_ptr__->pos_).lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->pos_).lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->pos_).posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->pos_).scopes_.c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (__return_storage_ptr__->pos_).scopes_.c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_map_size = 0;
      (__return_storage_ptr__->pos_).scopes_.c.
      super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->str_)._M_string_length = 0;
      (__return_storage_ptr__->str_).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->str_).field_2 + 8) = 0;
      (__return_storage_ptr__->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->pos_).lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      match_t::match_t(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this = pcVar1[-1].cur._M_current;
    if ((this->type_ == param) &&
       ((this->m_).param.flags_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_).param.flags_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      sVar2 = parameter::match((parameter *)this,arg);
      if (sVar2.at_ == 0) {
        if (sVar2.length_ == arg->_M_string_length) {
          std::__cxx11::string::string((string *)&local_180,(string *)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_c0,pos);
          match_t::match_t(__return_storage_ptr__,&local_180,&local_c0);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_c0);
          this_00 = &local_180;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_1a0,(ulong)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_160,pos);
          match_t::match_t(__return_storage_ptr__,&local_1a0,&local_160);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_160);
          this_00 = &local_1a0;
        }
        std::__cxx11::string::~string((string *)this_00);
        return __return_storage_ptr__;
      }
    }
    scoped_dfs_traverser::operator++(pos);
  } while( true );
}

Assistant:

match_t
prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
             const ParamSelector& select)
{
    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                const auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else {
                        return match_t{arg.substr(match.at(), match.length()),
                                       std::move(pos)};
                    }
                }
            }
        }
        ++pos;
    }
    return match_t{};
}